

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

IndexType GetIndexTypeFromString
                    (char16 *propertyName,charcount_t propertyLength,ScriptContext *scriptContext,
                    uint32 *index,PropertyRecord **propertyRecord,bool createIfNotFound)

{
  BOOL BVar1;
  bool createIfNotFound_local;
  PropertyRecord **propertyRecord_local;
  uint32 *index_local;
  ScriptContext *scriptContext_local;
  charcount_t propertyLength_local;
  char16 *propertyName_local;
  
  BVar1 = Js::JavascriptOperators::TryConvertToUInt32(propertyName,propertyLength,index);
  if ((BVar1 == 0) || (*index == 0xffffffff)) {
    if (createIfNotFound) {
      Js::ScriptContext::GetOrAddPropertyRecord
                (scriptContext,propertyName,propertyLength,propertyRecord);
    }
    else {
      Js::ScriptContext::FindPropertyRecord
                (scriptContext,propertyName,propertyLength,propertyRecord);
    }
    propertyName_local._4_4_ = IndexType_PropertyId;
  }
  else {
    propertyName_local._4_4_ = IndexType_Number;
  }
  return propertyName_local._4_4_;
}

Assistant:

IndexType GetIndexTypeFromString(char16 const * propertyName, charcount_t propertyLength, ScriptContext* scriptContext, uint32* index, PropertyRecord const** propertyRecord, bool createIfNotFound)
    {
        if (JavascriptOperators::TryConvertToUInt32(propertyName, propertyLength, index) &&
            (*index != JavascriptArray::InvalidIndex))
        {
            return IndexType_Number;
        }
        else
        {
            if (createIfNotFound)
            {
                scriptContext->GetOrAddPropertyRecord(propertyName, propertyLength, propertyRecord);
            }
            else
            {
                scriptContext->FindPropertyRecord(propertyName, propertyLength, propertyRecord);
            }
            return IndexType_PropertyId;
        }
    }